

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_last_val_which(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int *in_RDX;
  CVmObjVector *in_RDI;
  int idx;
  undefined4 in_stack_00000028;
  vm_obj_id_t in_stack_0000003c;
  CVmObjVector *in_stack_00000040;
  size_t in_stack_ffffffffffffffc8;
  
  getp_last_index_which
            (in_stack_00000040,in_stack_0000003c,(vm_val_t *)this,
             (uint *)CONCAT44(self,in_stack_00000028));
  if (*in_RDX == 7) {
    get_element(in_RDI,in_stack_ffffffffffffffc8,(vm_val_t *)0x34bfe3);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_last_val_which(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc)
{
    /* get the index of the value using lastIndexWhich */
    getp_last_index_which(vmg_ self, retval, argc);

    /* if the return value is a valid index, get the value at the index */
    if (retval->typ == VM_INT)
    {
        int idx;
        
        /* get the element as the return value */
        idx = (int)retval->val.intval;
        get_element(idx - 1, retval);
    }

    /* handled */
    return TRUE;
}